

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O3

float __thiscall
MT32Emu::LA32FloatWaveGenerator::getPCMSample(LA32FloatWaveGenerator *this,uint position)

{
  ushort uVar1;
  ulong uVar2;
  float fVar3;
  double dVar4;
  
  uVar2 = (ulong)position;
  if (this->pcmWaveLength <= position) {
    if (this->pcmWaveLooped != true) {
      return 0.0;
    }
    uVar2 = (ulong)position % (ulong)this->pcmWaveLength;
  }
  uVar1 = this->pcmWaveAddress[uVar2];
  dVar4 = exp((double)((float)(int)((uVar1 & 0x7fff) - 0x8013) * 0.00048828125 * 0.6931472));
  fVar3 = (float)dVar4;
  if ((short)uVar1 < 0) {
    fVar3 = -fVar3;
  }
  return fVar3;
}

Assistant:

float LA32FloatWaveGenerator::getPCMSample(unsigned int position) {
	if (position >= pcmWaveLength) {
		if (!pcmWaveLooped) {
			return 0;
		}
		position = position % pcmWaveLength;
	}
	Bit16s pcmSample = pcmWaveAddress[position];
	float sampleValue = EXP2F(((pcmSample & 32767) - 32787.0f) / 2048.0f);
	return ((pcmSample & 32768) == 0) ? sampleValue : -sampleValue;
}